

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bsplitstrcb(const_bstring str,const_bstring splitStr,int pos,_func_int_void_ptr_int_int *cb,
               void *parm)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar3 = 0xffffffff;
  if ((((-1 < pos) && (str != (const_bstring)0x0)) && (cb != (_func_int_void_ptr_int_int *)0x0)) &&
     (((splitStr != (const_bstring)0x0 && (pos <= str->slen)) &&
      (iVar1 = splitStr->slen, -1 < iVar1)))) {
    if (iVar1 == 1) {
      iVar1 = bsplitcb(str,*splitStr->data,pos,cb,parm);
      return iVar1;
    }
    if (iVar1 == 0) {
      uVar3 = 0;
      if (pos < str->slen) {
        do {
          iVar1 = (*cb)(parm,pos,1);
          if (iVar1 < 0) {
            return iVar1;
          }
          pos = pos + 1;
          uVar3 = 0;
        } while (pos < str->slen);
      }
    }
    else {
      iVar1 = str->slen;
      iVar2 = splitStr->slen;
      iVar4 = pos;
      if (pos <= iVar1 - iVar2) {
        do {
          iVar1 = bcmp(splitStr->data,str->data + iVar4,(long)iVar2);
          iVar5 = iVar4;
          if (iVar1 == 0) {
            iVar1 = (*cb)(parm,pos,iVar4 - pos);
            if (iVar1 < 0) {
              return iVar1;
            }
            pos = iVar4 + splitStr->slen;
            iVar5 = pos;
          }
          iVar1 = str->slen;
          iVar2 = splitStr->slen;
          iVar4 = iVar5 + 1;
        } while (iVar5 < iVar1 - iVar2);
      }
      uVar3 = (*cb)(parm,pos,iVar1 - pos);
      uVar3 = uVar3 & (int)uVar3 >> 0x1f;
    }
  }
  return uVar3;
}

Assistant:

int bsplitstrcb (const_bstring str, const_bstring splitStr, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen
	 || splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;

	if (0 == splitStr->slen) {
		for (i=pos; i < str->slen; i++) {
			if ((ret = cb (parm, i, 1)) < 0) return ret;
		}
		return BSTR_OK;
	}

	if (splitStr->slen == 1)
		return bsplitcb (str, splitStr->data[0], pos, cb, parm);

	for (i=p=pos; i <= str->slen - splitStr->slen; i++) {
		if (0 == bstr__memcmp (splitStr->data, str->data + i,
		                       splitStr->slen)) {
			if ((ret = cb (parm, p, i - p)) < 0) return ret;
			i += splitStr->slen;
			p = i;
		}
	}
	if ((ret = cb (parm, p, str->slen - p)) < 0) return ret;
	return BSTR_OK;
}